

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_edge_tet_quality
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar1;
  uint uVar2;
  REF_BOOL RVar3;
  REF_BOOL RVar4;
  ulong uVar5;
  long lVar6;
  REF_INT RVar7;
  int iVar8;
  double dVar9;
  REF_DBL volume1;
  REF_DBL volume0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  REF_INT nodes [27];
  double local_f8;
  int local_f0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *allowed = 0;
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 == -1) {
    local_f8 = 1.0;
  }
  else {
    RVar7 = ref_cell->ref_adj->item[(int)uVar5].ref;
    local_f8 = 1.0;
    do {
      if (0 < ref_cell->node_per) {
        lVar6 = 0;
        do {
          if (ref_cell->c2n[(long)ref_cell->size_per * (long)RVar7 + lVar6] == node1) {
            uVar2 = ref_cell_nodes(ref_cell,RVar7,local_a8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x252,"ref_split_edge_tet_quality",(ulong)uVar2,"cell nodes");
              return uVar2;
            }
            uVar2 = ref_node_tet_quality(ref_node,local_a8,&local_b0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x254,"ref_split_edge_tet_quality",(ulong)uVar2,"q");
              return uVar2;
            }
            if (local_b0 <= local_f8) {
              local_f8 = local_b0;
            }
          }
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < ref_cell->node_per);
      }
      pRVar1 = ref_cell->ref_adj->item;
      local_f0 = (int)uVar5;
      iVar8 = pRVar1[local_f0].next;
      uVar5 = (ulong)iVar8;
      if (uVar5 == 0xffffffffffffffff) {
        RVar7 = -1;
      }
      else {
        RVar7 = pRVar1[uVar5].ref;
      }
    } while (iVar8 != -1);
  }
  RVar7 = -1;
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 != -1) {
    RVar7 = ref_cell->ref_adj->item[(int)uVar5].ref;
  }
  while ((int)uVar5 != -1) {
    if (0 < ref_cell->node_per) {
      iVar8 = 0;
      do {
        if (ref_cell->c2n[ref_cell->size_per * RVar7 + iVar8] == node1) {
          uVar2 = ref_cell_nodes(ref_cell,RVar7,local_a8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x259,"ref_split_edge_tet_quality",(ulong)uVar2,"cell nodes");
            return uVar2;
          }
          if (0 < ref_cell->node_per) {
            lVar6 = 0;
            do {
              if (local_a8[lVar6] == node0) {
                local_a8[lVar6] = new_node;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->node_per);
          }
          uVar2 = ref_node_tet_quality(ref_node,local_a8,&local_b8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x25d,"ref_split_edge_tet_quality",(ulong)uVar2,"q0");
            return uVar2;
          }
          uVar2 = ref_node_tet_vol(ref_node,local_a8,&local_c8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x25e,"ref_split_edge_tet_quality",(ulong)uVar2,"vol0");
            return uVar2;
          }
          if (0 < ref_cell->node_per) {
            lVar6 = 0;
            do {
              if (local_a8[lVar6] == new_node) {
                local_a8[lVar6] = node0;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->node_per);
          }
          if (0 < ref_cell->node_per) {
            lVar6 = 0;
            do {
              if (local_a8[lVar6] == node1) {
                local_a8[lVar6] = new_node;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->node_per);
          }
          uVar2 = ref_node_tet_quality(ref_node,local_a8,&local_c0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x266,"ref_split_edge_tet_quality",(ulong)uVar2,"q1");
            return uVar2;
          }
          uVar2 = ref_node_tet_vol(ref_node,local_a8,&local_d0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x267,"ref_split_edge_tet_quality",(ulong)uVar2,"vol1");
            return uVar2;
          }
          dVar9 = ref_grid->adapt->split_quality_absolute;
          RVar3 = 0;
          RVar4 = 0;
          if ((((local_b8 < dVar9) || (RVar4 = 0, local_c0 < dVar9)) ||
              (dVar9 = ref_grid->adapt->split_quality_relative * local_f8, RVar4 = RVar3,
              local_b8 < dVar9)) ||
             (((local_c0 < dVar9 || (local_c8 < ref_node->min_volume)) ||
              (local_d0 < ref_node->min_volume)))) goto LAB_001ec9e3;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < ref_cell->node_per);
    }
    pRVar1 = ref_cell->ref_adj->item;
    uVar5 = (ulong)pRVar1[(int)uVar5].next;
    if (uVar5 == 0xffffffffffffffff) {
      RVar7 = -1;
    }
    else {
      RVar7 = pRVar1[uVar5].ref;
    }
  }
  RVar4 = 1;
LAB_001ec9e3:
  *allowed = RVar4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tet_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL volume0, volume1;
  REF_DBL min_existing_quality;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume0), "vol0");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume1), "vol1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        volume0 < ref_node_min_volume(ref_node) ||
        volume1 < ref_node_min_volume(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}